

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cc
# Opt level: O1

void __thiscall hgdb::rtl::ExpressionPrinter::handle(ExpressionPrinter *this,IntegerLiteral *i)

{
  optional<int> oVar1;
  _Storage<int,_true> _Var2;
  SVInt v;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_20;
  uint local_18;
  byte local_13;
  
  slang::SVInt::SVInt((SVInt *)&local_20,&i->valueStorage);
  oVar1 = slang::SVInt::as<int,void>((SVInt *)&local_20);
  _Var2._M_value = 0;
  if (((ulong)oVar1.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    _Var2._M_value =
         oVar1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_payload;
  }
  std::ostream::operator<<((ostream *)&this->field_0x18,_Var2._M_value);
  if (((0x40 < local_18) || ((local_13 & 1) != 0)) && ((void *)local_20.val != (void *)0x0)) {
    operator_delete__(local_20.pVal);
  }
  return;
}

Assistant:

void handle(const slang::ast::IntegerLiteral &i) {
        auto v = i.getValue();
        auto uint_opt = v.as<int>();
        int value = uint_opt ? *uint_opt : 0;
        ss_ << value;
    }